

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O1

void __thiscall CFFFileInput::FreeData(CFFFileInput *this)

{
  StringList *this_00;
  FontDictInfo *pFVar1;
  CharStrings *pCVar2;
  FontDictInfo **ppFVar3;
  TopDictInfo *pTVar4;
  CharStringsIndex pCVar5;
  void *pvVar6;
  PrivateDictInfo *pPVar7;
  _Base_ptr p_Var8;
  pointer ppCVar9;
  CharSetInfo *pCVar10;
  pointer ppEVar11;
  EncodingsInfo *pEVar12;
  _Rb_tree_node_base *p_Var13;
  long lVar14;
  ulong uVar15;
  UShortToDictOperandListMap *this_01;
  pointer ppCVar16;
  pointer ppEVar17;
  
  this_00 = &this->mName;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  (this->mName).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mName).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mName).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::clear(&(this->mNameToIndex)._M_t);
  if (this->mTopDictIndex != (TopDictInfo *)0x0) {
    if (this->mFontsCount != 0) {
      uVar15 = 0;
      do {
        pFVar1 = this->mTopDictIndex[uVar15].mFDArray;
        if (pFVar1 != (FontDictInfo *)0x0) {
          pCVar2 = pFVar1[-1].mPrivateDict.mLocalSubrs;
          if (pCVar2 != (CharStrings *)0x0) {
            this_01 = &pFVar1[(long)((long)&pCVar2[-1].mCharStringsIndex + 7)].mFontDict;
            lVar14 = (long)pCVar2 * -0x88;
            do {
              std::
              _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
              ::~_Rb_tree(&(((PrivateDictInfo *)(this_01 + 1))->mPrivateDict)._M_t);
              std::
              _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
              ::~_Rb_tree(&this_01->_M_t);
              this_01 = (UShortToDictOperandListMap *)((long)(this_01 + -3) + 8);
              lVar14 = lVar14 + 0x88;
            } while (lVar14 != 0);
          }
          operator_delete__(&pFVar1[-1].mPrivateDict.mLocalSubrs,(long)pCVar2 * 0x88 + 8);
        }
        ppFVar3 = this->mTopDictIndex[uVar15].mFDSelect;
        if (ppFVar3 != (FontDictInfo **)0x0) {
          operator_delete__(ppFVar3);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < this->mFontsCount);
    }
    pTVar4 = this->mTopDictIndex;
    if (pTVar4 != (TopDictInfo *)0x0) {
      ppFVar3 = pTVar4[-1].mFDSelect;
      if (ppFVar3 != (FontDictInfo **)0x0) {
        lVar14 = (long)ppFVar3 * 0x50;
        do {
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
                       *)(&pTVar4[-1].mTopDict._M_t._M_impl.field_0x0 + lVar14));
          lVar14 = lVar14 + -0x50;
        } while (lVar14 != 0);
      }
      operator_delete__(&pTVar4[-1].mFDSelect,(long)ppFVar3 * 0x50 + 8);
    }
    this->mTopDictIndex = (TopDictInfo *)0x0;
  }
  if (this->mStrings != (char **)0x0) {
    if (this->mStringsCount != 0) {
      uVar15 = 0;
      do {
        if (this->mStrings[uVar15] != (char *)0x0) {
          operator_delete__(this->mStrings[uVar15]);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < this->mStringsCount);
    }
    if (this->mStrings != (char **)0x0) {
      operator_delete__(this->mStrings);
    }
    this->mStrings = (char **)0x0;
  }
  std::
  _Rb_tree<const_char_*,_std::pair<const_char_*const,_unsigned_short>,_std::_Select1st<std::pair<const_char_*const,_unsigned_short>_>,_StringLess,_std::allocator<std::pair<const_char_*const,_unsigned_short>_>_>
  ::clear(&(this->mStringToSID)._M_t);
  pCVar5 = (this->mGlobalSubrs).mCharStringsIndex;
  if (pCVar5 != (CharStringsIndex)0x0) {
    operator_delete__(pCVar5);
  }
  (this->mGlobalSubrs).mCharStringsIndex = (CharStringsIndex)0x0;
  if (this->mCharStrings != (CharStrings *)0x0) {
    if (this->mFontsCount != 0) {
      lVar14 = 8;
      uVar15 = 0;
      do {
        pvVar6 = *(void **)(&this->mCharStrings->mCharStringsType + lVar14);
        if (pvVar6 != (void *)0x0) {
          operator_delete__(pvVar6);
        }
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar15 < this->mFontsCount);
    }
    if (this->mCharStrings != (CharStrings *)0x0) {
      operator_delete(this->mCharStrings,0x10);
    }
    this->mCharStrings = (CharStrings *)0x0;
  }
  pPVar7 = this->mPrivateDicts;
  if (pPVar7 != (PrivateDictInfo *)0x0) {
    pCVar2 = pPVar7[-1].mLocalSubrs;
    if (pCVar2 != (CharStrings *)0x0) {
      lVar14 = (long)pCVar2 * 0x48;
      do {
        std::
        _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
                     *)((long)pPVar7 + lVar14 + -0x38));
        lVar14 = lVar14 + -0x48;
      } while (lVar14 != 0);
    }
    operator_delete__(&pPVar7[-1].mLocalSubrs,(long)pCVar2 * 0x48 + 8);
  }
  this->mPrivateDicts = (PrivateDictInfo *)0x0;
  for (p_Var13 = (this->mLocalSubrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != &(this->mLocalSubrs)._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    p_Var8 = (p_Var13[1]._M_parent)->_M_parent;
    if (p_Var8 != (_Base_ptr)0x0) {
      operator_delete__(p_Var8);
    }
    if (p_Var13[1]._M_parent != (_Base_ptr)0x0) {
      operator_delete(p_Var13[1]._M_parent,0x10);
    }
  }
  for (ppCVar16 = (this->mCharSets).
                  super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppCVar9 = (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, ppCVar16 != ppCVar9;
      ppCVar16 = ppCVar16 + 1) {
    if ((*ppCVar16)->mSIDs != (unsigned_short *)0x0) {
      operator_delete__((*ppCVar16)->mSIDs);
    }
    std::
    _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_IndexElement_*>,_std::_Select1st<std::pair<const_unsigned_short,_IndexElement_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
    ::clear(&((*ppCVar16)->mSIDToGlyphMap)._M_t);
    pCVar10 = *ppCVar16;
    if (pCVar10 != (CharSetInfo *)0x0) {
      std::
      _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_IndexElement_*>,_std::_Select1st<std::pair<const_unsigned_short,_IndexElement_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
      ::~_Rb_tree(&(pCVar10->mSIDToGlyphMap)._M_t);
      operator_delete(pCVar10,0x40);
    }
  }
  ppCVar16 = (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar9 != ppCVar16) {
    (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar16;
  }
  for (ppEVar17 = (this->mEncodings).
                  super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppEVar11 = (this->mEncodings).
                 super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
                 super__Vector_impl_data._M_finish, ppEVar17 != ppEVar11; ppEVar17 = ppEVar17 + 1) {
    if ((*ppEVar17)->mEncoding != (Byte *)0x0) {
      operator_delete__((*ppEVar17)->mEncoding);
    }
    pEVar12 = *ppEVar17;
    if (pEVar12 != (EncodingsInfo *)0x0) {
      std::
      _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~_Rb_tree(&(pEVar12->mSupplements)._M_t);
      operator_delete(pEVar12,0x50);
    }
  }
  ppEVar17 = (this->mEncodings).
             super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppEVar11 != ppEVar17) {
    (this->mEncodings).super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppEVar17;
  }
  return;
}

Assistant:

void CFFFileInput::FreeData()
{
	mName.clear();
	mNameToIndex.clear();
	if(mTopDictIndex != NULL)
	{
		for(unsigned long i=0; i < mFontsCount;++i)
		{
			delete[] mTopDictIndex[i].mFDArray;
			delete[] mTopDictIndex[i].mFDSelect;
		}
		delete[] mTopDictIndex;
		mTopDictIndex = NULL;
	}
	if(mStrings != NULL)
	{
		for(unsigned long i =0 ; i <mStringsCount; ++ i)
			delete[] mStrings[i];
		delete[] mStrings;
		mStrings = NULL;
	}
	mStringToSID.clear();
	delete[] mGlobalSubrs.mCharStringsIndex;
	mGlobalSubrs.mCharStringsIndex = NULL;
	if(mCharStrings != NULL)
	{
		for(unsigned long i=0; i < mFontsCount; ++i)
			delete[] mCharStrings[i].mCharStringsIndex;
		delete mCharStrings;
		mCharStrings = NULL;
	}
	delete[] mPrivateDicts;
	mPrivateDicts = NULL;

	LongFilePositionTypeToCharStringsMap::iterator itLocalSubrs = mLocalSubrs.begin();
	for(; itLocalSubrs != mLocalSubrs.end(); ++itLocalSubrs)
	{
		delete[] itLocalSubrs->second->mCharStringsIndex;
		delete itLocalSubrs->second;
	}

	CharSetInfoVector::iterator itCharSets = mCharSets.begin();
	for(; itCharSets != mCharSets.end(); ++itCharSets)
	{
		delete[] (*itCharSets)->mSIDs;
		(*itCharSets)->mSIDToGlyphMap.clear();
		delete (*itCharSets);
	}
	mCharSets.clear();

	EncodingsInfoVector::iterator itEncodings = mEncodings.begin();
	for(; itEncodings != mEncodings.end(); ++itEncodings)
	{
		delete[] (*itEncodings)->mEncoding;
		delete (*itEncodings);
	}
	mEncodings.clear();
}